

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_passthrough_output_only_Test::~cubeb_resampler_passthrough_output_only_Test
          (cubeb_resampler_passthrough_output_only_Test *this)

{
  void *in_RDI;
  
  ~cubeb_resampler_passthrough_output_only_Test
            ((cubeb_resampler_passthrough_output_only_Test *)0x110838);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_output_only)
{
  // Test that the passthrough resampler works when there is only an output stream.
  cubeb_stream_params output_params;

  const size_t output_channels = 2;
  output_params.channels = output_channels;
  output_params.rate = 44100;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  int target_rate = output_params.rate;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, nullptr, &output_params,
                           target_rate, cb_passthrough_resampler_output, nullptr,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  float output_buffer[output_channels * 256];

  long got;
  for (uint32_t i = 0; i < 30; i++) {
    got = cubeb_resampler_fill(resampler, nullptr, nullptr, output_buffer, 256);
    ASSERT_EQ(got, 256);
  }

  cubeb_resampler_destroy(resampler);
}